

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rootindexproxymodel.cpp
# Opt level: O1

void __thiscall tst_RootIndexProxyModel::bug53Rows(tst_RootIndexProxyModel *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  QAbstractItemModelTester *pQVar4;
  ComplexModel baseModel;
  RootIndexProxyModel proxyModel2;
  RootIndexProxyModel proxyModel1;
  QSignalSpy proxy1RowsAboutToBeInsertedSpy;
  QSignalSpy proxy1RowsInsertedSpy;
  QSignalSpy proxy2RowsAboutToBeInsertedSpy;
  QSignalSpy proxy2RowsInsertedSpy;
  QSignalSpy proxy1RowsAboutToBeRemovedSpy;
  QSignalSpy proxy2rowsAboutToBeMovedSpy;
  QSignalSpy proxy2rowsMovedSpy;
  QSignalSpy proxy1rowsAboutToBeMovedSpy;
  QSignalSpy proxy1rowsMovedSpy;
  QSignalSpy proxy2RowsRemovedSpy;
  QSignalSpy proxy2RowsAboutToBeRemovedSpy;
  QSignalSpy proxy1RowsRemovedSpy;
  undefined1 local_680 [16];
  QModelIndex local_670;
  QModelIndex local_658;
  undefined8 local_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined1 local_628 [32];
  longlong local_608;
  long local_5f0;
  undefined1 local_5a8 [32];
  longlong local_588;
  long local_570;
  QSignalSpy local_528;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  QSignalSpy local_490;
  QSignalSpy local_410;
  QSignalSpy local_390;
  QSignalSpy local_310;
  QSignalSpy local_290;
  QSignalSpy local_210;
  QSignalSpy local_190;
  QSignalSpy local_110;
  QSignalSpy local_90;
  
  QStandardItemModel::QStandardItemModel((QStandardItemModel *)local_680,(QObject *)0x0);
  local_628._0_8_ = -NAN;
  local_628._8_8_ = 0;
  local_628._16_8_ = 0;
  bVar1 = (bool)(**(code **)(local_680._0_8_ + 0x100))((QStandardItemModel *)local_680,0,1);
  cVar2 = QTest::qVerify(bVar1,"baseModel.insertColumn(0)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                         ,0x1c9);
  if (cVar2 != '\0') {
    local_628._0_8_ = (PrivateShared *)0xffffffffffffffff;
    local_628._8_8_ = 0;
    local_628._16_8_ = 0;
    bVar1 = (bool)QStandardItemModel::insertRows((int)local_680,0,(QModelIndex *)0x2);
    cVar2 = QTest::qVerify(bVar1,"baseModel.insertRows(0, 2)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                           ,0x1ca);
    if (cVar2 != '\0') {
      local_5a8._0_8_ = (PrivateShared *)0xffffffffffffffff;
      local_5a8._8_8_ = 0;
      local_5a8._16_8_ = 0;
      QStandardItemModel::index((int)local_628,(int)local_680,(QModelIndex *)0x0);
      bVar1 = (bool)(**(code **)(local_680._0_8_ + 0x100))(local_680,0,1,local_628);
      cVar2 = QTest::qVerify(bVar1,"baseModel.insertColumn(0, baseModel.index(0, 0))","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                             ,0x1cb);
      if (cVar2 != '\0') {
        local_5a8._0_8_ = (PrivateShared *)0xffffffffffffffff;
        local_5a8._8_8_ = 0;
        local_5a8._16_8_ = 0;
        QStandardItemModel::index((int)local_628,(int)local_680,(QModelIndex *)0x0);
        bVar1 = (bool)QStandardItemModel::insertRows((int)local_680,0,(QModelIndex *)0x2);
        cVar2 = QTest::qVerify(bVar1,"baseModel.insertRows(0, 2, baseModel.index(0, 0))","",
                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                               ,0x1cc);
        if (cVar2 != '\0') {
          local_5a8._0_8_ = (PrivateShared *)0xffffffffffffffff;
          local_5a8._8_8_ = 0;
          local_5a8._16_8_ = 0;
          QStandardItemModel::index((int)local_628,(int)local_680,(QModelIndex *)0x1);
          bVar1 = (bool)(**(code **)(local_680._0_8_ + 0x100))(local_680,0,1,local_628);
          cVar2 = QTest::qVerify(bVar1,"baseModel.insertColumn(0, baseModel.index(1, 0))","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                 ,0x1cd);
          if (cVar2 != '\0') {
            local_5a8._0_8_ = (PrivateShared *)0xffffffffffffffff;
            local_5a8._8_8_ = 0;
            local_5a8._16_8_ = 0;
            QStandardItemModel::index((int)local_628,(int)local_680,(QModelIndex *)0x1);
            bVar1 = (bool)QStandardItemModel::insertRows((int)local_680,0,(QModelIndex *)0x1);
            cVar2 = QTest::qVerify(bVar1,"baseModel.insertRows(0, 1, baseModel.index(1, 0))","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                   ,0x1ce);
            if (cVar2 != '\0') {
              local_528.super_QObject = (QObject)0xff;
              local_528._1_7_ = 0xffffffffffffff;
              local_528._8_8_ = 0;
              local_528.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
              QStandardItemModel::index((int)local_5a8,(int)local_680,(QModelIndex *)0x0);
              QVariant::QVariant((QVariant *)local_628,(QChar)0x41);
              bVar1 = (bool)QStandardItemModel::setData
                                      ((QModelIndex *)local_680,(QVariant *)local_5a8,(int)local_628
                                      );
              cVar2 = QTest::qVerify(bVar1,
                                     "baseModel.setData(baseModel.index(0, 0), QChar(QLatin1Char(\'A\')))"
                                     ,"",
                                     "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                     ,0x1cf);
              QVariant::~QVariant((QVariant *)local_628);
              if (cVar2 != '\0') {
                local_490.super_QObject = (QObject)0xff;
                local_490._1_7_ = 0xffffffffffffff;
                local_490._8_8_ = 0;
                local_490.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
                QStandardItemModel::index((int)&local_528,(int)local_680,(QModelIndex *)0x0);
                QStandardItemModel::index((int)local_5a8,(int)local_680,(QModelIndex *)0x0);
                QVariant::QVariant((QVariant *)local_628,(QChar)0x43);
                bVar1 = (bool)QStandardItemModel::setData
                                        ((QModelIndex *)local_680,(QVariant *)local_5a8,
                                         (int)local_628);
                cVar2 = QTest::qVerify(bVar1,
                                       "baseModel.setData(baseModel.index(0, 0, baseModel.index(0, 0)), QChar(QLatin1Char(\'C\')))"
                                       ,"",
                                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                       ,0x1d0);
                QVariant::~QVariant((QVariant *)local_628);
                if (cVar2 != '\0') {
                  local_490.super_QObject = (QObject)0xff;
                  local_490._1_7_ = 0xffffffffffffff;
                  local_490._8_8_ = 0;
                  local_490.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
                  QStandardItemModel::index((int)&local_528,(int)local_680,(QModelIndex *)0x0);
                  QStandardItemModel::index((int)local_5a8,(int)local_680,(QModelIndex *)0x1);
                  QVariant::QVariant((QVariant *)local_628,(QChar)0x44);
                  bVar1 = (bool)QStandardItemModel::setData
                                          ((QModelIndex *)local_680,(QVariant *)local_5a8,
                                           (int)local_628);
                  cVar2 = QTest::qVerify(bVar1,
                                         "baseModel.setData(baseModel.index(1, 0, baseModel.index(0, 0)), QChar(QLatin1Char(\'D\')))"
                                         ,"",
                                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                         ,0x1d1);
                  QVariant::~QVariant((QVariant *)local_628);
                  if (cVar2 != '\0') {
                    local_528.super_QObject = (QObject)0xff;
                    local_528._1_7_ = 0xffffffffffffff;
                    local_528._8_8_ = 0;
                    local_528.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
                    QStandardItemModel::index((int)local_5a8,(int)local_680,(QModelIndex *)0x1);
                    QVariant::QVariant((QVariant *)local_628,(QChar)0x42);
                    bVar1 = (bool)QStandardItemModel::setData
                                            ((QModelIndex *)local_680,(QVariant *)local_5a8,
                                             (int)local_628);
                    cVar2 = QTest::qVerify(bVar1,
                                           "baseModel.setData(baseModel.index(1, 0), QChar(QLatin1Char(\'B\')))"
                                           ,"",
                                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                           ,0x1d2);
                    QVariant::~QVariant((QVariant *)local_628);
                    if (cVar2 != '\0') {
                      local_490.super_QObject = (QObject)0xff;
                      local_490._1_7_ = 0xffffffffffffff;
                      local_490._8_8_ = 0;
                      local_490.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
                      QStandardItemModel::index((int)&local_528,(int)local_680,(QModelIndex *)0x1);
                      QStandardItemModel::index((int)local_5a8,(int)local_680,(QModelIndex *)0x0);
                      QVariant::QVariant((QVariant *)local_628,(QChar)0x45);
                      bVar1 = (bool)QStandardItemModel::setData
                                              ((QModelIndex *)local_680,(QVariant *)local_5a8,
                                               (int)local_628);
                      cVar2 = QTest::qVerify(bVar1,
                                             "baseModel.setData(baseModel.index(0, 0, baseModel.index(1, 0)), QChar(QLatin1Char(\'E\')))"
                                             ,"",
                                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                             ,0x1d3);
                      QVariant::~QVariant((QVariant *)local_628);
                      if (cVar2 != '\0') {
                        RootIndexProxyModel::RootIndexProxyModel
                                  ((RootIndexProxyModel *)&local_658,(QObject *)0x0);
                        pQVar4 = (QAbstractItemModelTester *)operator_new(0x10);
                        QAbstractItemModelTester::QAbstractItemModelTester
                                  (pQVar4,(QAbstractItemModel *)&local_658,QtTest,
                                   (QObject *)local_680);
                        *(undefined ***)pQVar4 = &PTR_metaObject_00125c88;
                        RootIndexProxyModel::setSourceModel((QAbstractItemModel *)&local_658);
                        local_5a8._0_8_ = -NAN;
                        local_5a8._8_8_ = 0;
                        local_5a8._16_8_ = 0;
                        QStandardItemModel::index((int)local_628,(int)local_680,(QModelIndex *)0x0);
                        RootIndexProxyModel::setRootIndex(&local_658);
                        RootIndexProxyModel::RootIndexProxyModel
                                  ((RootIndexProxyModel *)(local_680 + 0x10),(QObject *)0x0);
                        pQVar4 = (QAbstractItemModelTester *)operator_new(0x10);
                        QAbstractItemModelTester::QAbstractItemModelTester
                                  (pQVar4,(QAbstractItemModel *)(local_680 + 0x10),QtTest,
                                   (QObject *)local_680);
                        *(undefined ***)pQVar4 = &PTR_metaObject_00125c88;
                        RootIndexProxyModel::setSourceModel
                                  ((QAbstractItemModel *)(local_680 + 0x10));
                        local_5a8._0_8_ = (PrivateShared *)0xffffffffffffffff;
                        local_5a8._8_8_ = 0;
                        local_5a8._16_8_ = 0;
                        QStandardItemModel::index((int)local_628,(int)local_680,(QModelIndex *)0x1);
                        RootIndexProxyModel::setRootIndex((QModelIndex *)(local_680 + 0x10));
                        QSignalSpy::QSignalSpy
                                  ((QSignalSpy *)local_628,(QObject *)&local_658,
                                   "2rowsAboutToBeInserted(QModelIndex, int, int)");
                        cVar2 = QTest::qVerify(local_5f0 != 0,
                                               "proxy1RowsAboutToBeInsertedSpy.isValid()","",
                                               "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                               ,0x1dd);
                        if (cVar2 != '\0') {
                          QSignalSpy::QSignalSpy
                                    ((QSignalSpy *)local_5a8,(QObject *)&local_658,
                                     "2rowsInserted(QModelIndex, int, int)");
                          cVar2 = QTest::qVerify(local_570 != 0,"proxy1RowsInsertedSpy.isValid()",""
                                                 ,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                 ,0x1df);
                          if (cVar2 != '\0') {
                            QSignalSpy::QSignalSpy
                                      (&local_528,(QObject *)(local_680 + 0x10),
                                       "2rowsAboutToBeInserted(QModelIndex, int, int)");
                            cVar2 = QTest::qVerify(local_528.sig.d.size != 0,
                                                   "proxy2RowsAboutToBeInsertedSpy.isValid()","",
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1e1);
                            if (cVar2 != '\0') {
                              QSignalSpy::QSignalSpy
                                        (&local_490,(QObject *)(local_680 + 0x10),
                                         "2rowsInserted(QModelIndex, int, int)");
                              cVar2 = QTest::qVerify(local_490.sig.d.size != 0,
                                                     "proxy2RowsInsertedSpy.isValid()","",
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1e3);
                              if (cVar2 != '\0') {
                                QSignalSpy::QSignalSpy
                                          (&local_410,(QObject *)&local_658,
                                           "2rowsAboutToBeRemoved(QModelIndex, int, int)");
                                cVar2 = QTest::qVerify(local_410.sig.d.size != 0,
                                                       "proxy1RowsAboutToBeRemovedSpy.isValid()","",
                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1e5);
                                if (cVar2 != '\0') {
                                  QSignalSpy::QSignalSpy
                                            (&local_90,(QObject *)&local_658,
                                             "2rowsRemoved(QModelIndex, int, int)");
                                  cVar2 = QTest::qVerify(local_90.sig.d.size != 0,
                                                         "proxy1RowsRemovedSpy.isValid()","",
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1e7);
                                  if (cVar2 != '\0') {
                                    QSignalSpy::QSignalSpy
                                              (&local_110,(QObject *)(local_680 + 0x10),
                                               "2rowsAboutToBeRemoved(QModelIndex, int, int)");
                                    cVar2 = QTest::qVerify(local_110.sig.d.size != 0,
                                                           "proxy2RowsAboutToBeRemovedSpy.isValid()"
                                                           ,"",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1e9);
                                    if (cVar2 != '\0') {
                                      QSignalSpy::QSignalSpy
                                                (&local_190,(QObject *)(local_680 + 0x10),
                                                 "2rowsRemoved(QModelIndex, int, int)");
                                      cVar2 = QTest::qVerify(local_190.sig.d.size != 0,
                                                             "proxy2RowsRemovedSpy.isValid()","",
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1eb);
                                      if (cVar2 != '\0') {
                                        QSignalSpy::QSignalSpy
                                                  (&local_210,(QObject *)&local_658,
                                                                                                      
                                                  "2rowsMoved(QModelIndex, int, int, QModelIndex, int)"
                                                  );
                                        cVar2 = QTest::qVerify(local_210.sig.d.size != 0,
                                                               "proxy1rowsMovedSpy.isValid()","",
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1ed);
                                        if (cVar2 != '\0') {
                                          QSignalSpy::QSignalSpy
                                                    (&local_290,(QObject *)&local_658,
                                                                                                          
                                                  "2rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)"
                                                  );
                                          cVar2 = QTest::qVerify(local_290.sig.d.size != 0,
                                                                                                                                  
                                                  "proxy1rowsAboutToBeMovedSpy.isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1ef);
                                          if (cVar2 != '\0') {
                                            QSignalSpy::QSignalSpy
                                                      (&local_310,(QObject *)(local_680 + 0x10),
                                                                                                              
                                                  "2rowsMoved(QModelIndex, int, int, QModelIndex, int)"
                                                  );
                                            cVar2 = QTest::qVerify(local_310.sig.d.size != 0,
                                                                   "proxy2rowsMovedSpy.isValid()",""
                                                                   ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1f1);
                                            if (cVar2 != '\0') {
                                              QSignalSpy::QSignalSpy
                                                        (&local_390,(QObject *)(local_680 + 0x10),
                                                                                                                  
                                                  "2rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)"
                                                  );
                                              cVar2 = QTest::qVerify(local_390.sig.d.size != 0,
                                                                                                                                          
                                                  "proxy2rowsAboutToBeMovedSpy.isValid()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,499);
                                              if (cVar2 != '\0') {
                                                local_4a8 = 0xffffffffffffffff;
                                                local_4a0 = 0;
                                                uStack_498 = 0;
                                                QStandardItemModel::index
                                                          ((int)&local_640,(int)local_680,
                                                           (QModelIndex *)0x0);
                                                bVar1 = (bool)(**(code **)(local_680._0_8_ + 0xf8))
                                                                        (local_680,2,1,&local_640);
                                                cVar2 = QTest::qVerify(bVar1,
                                                  "baseModel.insertRow(2, baseModel.index(0, 0))",""
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,500);
                                                if (cVar2 != '\0') {
                                                  local_640 = 0xffffffffffffffff;
                                                  local_638 = 0;
                                                  uStack_630 = 0;
                                                  iVar3 = RootIndexProxyModel::rowCount(&local_658);
                                                  cVar2 = QTest::qCompare(iVar3,3,
                                                  "proxyModel1.rowCount()","3",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1f5);
                                                  if (cVar2 != '\0') {
                                                    local_640 = 0xffffffffffffffff;
                                                    local_638 = 0;
                                                    uStack_630 = 0;
                                                    iVar3 = RootIndexProxyModel::rowCount
                                                                      ((QModelIndex *)
                                                                       (local_680 + 0x10));
                                                    cVar2 = QTest::qCompare(iVar3,1,
                                                  "proxyModel2.rowCount()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1f6);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_528.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2RowsAboutToBeInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1f7);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_490.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2RowsInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1f8);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_410.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1RowsAboutToBeRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1f9);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_90.
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1RowsRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1fa);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_110.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2RowsAboutToBeRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1fb);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_190.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2RowsRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1fc);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_290.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1rowsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1fd);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_210.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1rowsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1fe);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_390.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2rowsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x1ff);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_310.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2rowsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x200);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qCompare(local_608,1,
                                                                                                                                                        
                                                  "proxy1RowsAboutToBeInsertedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x201);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qCompare(local_588,1,
                                                                                                                                                        
                                                  "proxy1RowsInsertedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x202);
                                                  if (cVar2 != '\0') {
                                                    QList<QList<QVariant>_>::clear
                                                              ((QList<QList<QVariant>_> *)
                                                               (local_628 + 0x10));
                                                    QList<QList<QVariant>_>::clear
                                                              ((QList<QList<QVariant>_> *)
                                                               (local_5a8 + 0x10));
                                                    local_4a8 = 0xffffffffffffffff;
                                                    local_4a0 = 0;
                                                    uStack_498 = 0;
                                                    QStandardItemModel::index
                                                              ((int)&local_640,(int)local_680,
                                                               (QModelIndex *)0x0);
                                                    bVar1 = (bool)(**(code **)(local_680._0_8_ +
                                                                              0x108))(local_680,2,1,
                                                                                      &local_640);
                                                    cVar2 = QTest::qVerify(bVar1,
                                                  "baseModel.removeRow(2, baseModel.index(0, 0))",""
                                                  ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x206);
                                                  if (cVar2 != '\0') {
                                                    local_640 = 0xffffffffffffffff;
                                                    local_638 = 0;
                                                    uStack_630 = 0;
                                                    iVar3 = RootIndexProxyModel::rowCount
                                                                      (&local_658);
                                                    cVar2 = QTest::qCompare(iVar3,2,
                                                  "proxyModel1.rowCount()","2",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x207);
                                                  if (cVar2 != '\0') {
                                                    local_640 = 0xffffffffffffffff;
                                                    local_638 = 0;
                                                    uStack_630 = 0;
                                                    iVar3 = RootIndexProxyModel::rowCount
                                                                      ((QModelIndex *)
                                                                       (local_680 + 0x10));
                                                    cVar2 = QTest::qCompare(iVar3,1,
                                                  "proxyModel2.rowCount()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x208);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qCompare(local_410.
                                                                                                                                                        
                                                  super_QList<QList<QVariant>_>.d.size,1,
                                                  "proxy1RowsAboutToBeRemovedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x209);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qCompare(local_410.
                                                                                                                                                        
                                                  super_QList<QList<QVariant>_>.d.size,1,
                                                  "proxy1RowsAboutToBeRemovedSpy.count()","1",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x20a);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_608 == 0,
                                                                                                                                                      
                                                  "proxy1RowsAboutToBeInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x20b);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_588 == 0,
                                                                                                                                                      
                                                  "proxy1RowsInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x20c);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_528.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2RowsAboutToBeInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x20d);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_490.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2RowsInsertedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x20e);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_110.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2RowsAboutToBeRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x20f);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_190.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2RowsRemovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x210);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_290.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1rowsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x211);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_210.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy1rowsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x212);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_390.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2rowsAboutToBeMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x213);
                                                  if (cVar2 != '\0') {
                                                    cVar2 = QTest::qVerify(local_310.
                                                                                                                                                      
                                                  super_QList<QList<QVariant>_>.d.size == 0,
                                                  "proxy2rowsMovedSpy.isEmpty()","",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RootIndexProxyModel/tst_rootindexproxymodel.cpp"
                                                  ,0x214);
                                                  if (cVar2 != '\0') {
                                                    QList<QList<QVariant>_>::clear
                                                              (&local_410.
                                                                super_QList<QList<QVariant>_>);
                                                    QList<QList<QVariant>_>::clear
                                                              (&local_410.
                                                                super_QList<QList<QVariant>_>);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                              QSignalSpy::~QSignalSpy(&local_390);
                                            }
                                            QSignalSpy::~QSignalSpy(&local_310);
                                          }
                                          QSignalSpy::~QSignalSpy(&local_290);
                                        }
                                        QSignalSpy::~QSignalSpy(&local_210);
                                      }
                                      QSignalSpy::~QSignalSpy(&local_190);
                                    }
                                    QSignalSpy::~QSignalSpy(&local_110);
                                  }
                                  QSignalSpy::~QSignalSpy(&local_90);
                                }
                                QSignalSpy::~QSignalSpy(&local_410);
                              }
                              QSignalSpy::~QSignalSpy(&local_490);
                            }
                            QSignalSpy::~QSignalSpy(&local_528);
                          }
                          QSignalSpy::~QSignalSpy((QSignalSpy *)local_5a8);
                        }
                        QSignalSpy::~QSignalSpy((QSignalSpy *)local_628);
                        RootIndexProxyModel::~RootIndexProxyModel
                                  ((RootIndexProxyModel *)(local_680 + 0x10));
                        RootIndexProxyModel::~RootIndexProxyModel((RootIndexProxyModel *)&local_658)
                        ;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  QStandardItemModel::~QStandardItemModel((QStandardItemModel *)local_680);
  return;
}

Assistant:

void tst_RootIndexProxyModel::bug53Rows()
{
#ifdef COMPLEX_MODEL_SUPPORT
    ComplexModel baseModel;
    QVERIFY(baseModel.insertColumn(0));
    QVERIFY(baseModel.insertRows(0, 2));
    QVERIFY(baseModel.insertColumn(0, baseModel.index(0, 0)));
    QVERIFY(baseModel.insertRows(0, 2, baseModel.index(0, 0)));
    QVERIFY(baseModel.insertColumn(0, baseModel.index(1, 0)));
    QVERIFY(baseModel.insertRows(0, 1, baseModel.index(1, 0)));
    QVERIFY(baseModel.setData(baseModel.index(0, 0), QChar(QLatin1Char('A'))));
    QVERIFY(baseModel.setData(baseModel.index(0, 0, baseModel.index(0, 0)), QChar(QLatin1Char('C'))));
    QVERIFY(baseModel.setData(baseModel.index(1, 0, baseModel.index(0, 0)), QChar(QLatin1Char('D'))));
    QVERIFY(baseModel.setData(baseModel.index(1, 0), QChar(QLatin1Char('B'))));
    QVERIFY(baseModel.setData(baseModel.index(0, 0, baseModel.index(1, 0)), QChar(QLatin1Char('E'))));
    RootIndexProxyModel proxyModel1;
    new ModelTest(&proxyModel1, &baseModel);
    proxyModel1.setSourceModel(&baseModel);
    proxyModel1.setRootIndex(baseModel.index(0, 0));
    RootIndexProxyModel proxyModel2;
    new ModelTest(&proxyModel2, &baseModel);
    proxyModel2.setSourceModel(&baseModel);
    proxyModel2.setRootIndex(baseModel.index(1, 0));
    QSignalSpy proxy1RowsAboutToBeInsertedSpy(&proxyModel1, SIGNAL(rowsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(proxy1RowsAboutToBeInsertedSpy.isValid());
    QSignalSpy proxy1RowsInsertedSpy(&proxyModel1, SIGNAL(rowsInserted(QModelIndex, int, int)));
    QVERIFY(proxy1RowsInsertedSpy.isValid());
    QSignalSpy proxy2RowsAboutToBeInsertedSpy(&proxyModel2, SIGNAL(rowsAboutToBeInserted(QModelIndex, int, int)));
    QVERIFY(proxy2RowsAboutToBeInsertedSpy.isValid());
    QSignalSpy proxy2RowsInsertedSpy(&proxyModel2, SIGNAL(rowsInserted(QModelIndex, int, int)));
    QVERIFY(proxy2RowsInsertedSpy.isValid());
    QSignalSpy proxy1RowsAboutToBeRemovedSpy(&proxyModel1, SIGNAL(rowsAboutToBeRemoved(QModelIndex, int, int)));
    QVERIFY(proxy1RowsAboutToBeRemovedSpy.isValid());
    QSignalSpy proxy1RowsRemovedSpy(&proxyModel1, SIGNAL(rowsRemoved(QModelIndex, int, int)));
    QVERIFY(proxy1RowsRemovedSpy.isValid());
    QSignalSpy proxy2RowsAboutToBeRemovedSpy(&proxyModel2, SIGNAL(rowsAboutToBeRemoved(QModelIndex, int, int)));
    QVERIFY(proxy2RowsAboutToBeRemovedSpy.isValid());
    QSignalSpy proxy2RowsRemovedSpy(&proxyModel2, SIGNAL(rowsRemoved(QModelIndex, int, int)));
    QVERIFY(proxy2RowsRemovedSpy.isValid());
    QSignalSpy proxy1rowsMovedSpy(&proxyModel1, SIGNAL(rowsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(proxy1rowsMovedSpy.isValid());
    QSignalSpy proxy1rowsAboutToBeMovedSpy(&proxyModel1, SIGNAL(rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(proxy1rowsAboutToBeMovedSpy.isValid());
    QSignalSpy proxy2rowsMovedSpy(&proxyModel2, SIGNAL(rowsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(proxy2rowsMovedSpy.isValid());
    QSignalSpy proxy2rowsAboutToBeMovedSpy(&proxyModel2, SIGNAL(rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(proxy2rowsAboutToBeMovedSpy.isValid());
    QVERIFY(baseModel.insertRow(2, baseModel.index(0, 0)));
    QCOMPARE(proxyModel1.rowCount(), 3);
    QCOMPARE(proxyModel2.rowCount(), 1);
    QVERIFY(proxy2RowsAboutToBeInsertedSpy.isEmpty());
    QVERIFY(proxy2RowsInsertedSpy.isEmpty());
    QVERIFY(proxy1RowsAboutToBeRemovedSpy.isEmpty());
    QVERIFY(proxy1RowsRemovedSpy.isEmpty());
    QVERIFY(proxy2RowsAboutToBeRemovedSpy.isEmpty());
    QVERIFY(proxy2RowsRemovedSpy.isEmpty());
    QVERIFY(proxy1rowsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy1rowsMovedSpy.isEmpty());
    QVERIFY(proxy2rowsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy2rowsMovedSpy.isEmpty());
    QCOMPARE(proxy1RowsAboutToBeInsertedSpy.count(), 1);
    QCOMPARE(proxy1RowsInsertedSpy.count(), 1);
    proxy1RowsAboutToBeInsertedSpy.clear();
    proxy1RowsInsertedSpy.clear();

    QVERIFY(baseModel.removeRow(2, baseModel.index(0, 0)));
    QCOMPARE(proxyModel1.rowCount(), 2);
    QCOMPARE(proxyModel2.rowCount(), 1);
    QCOMPARE(proxy1RowsAboutToBeRemovedSpy.count(), 1);
    QCOMPARE(proxy1RowsAboutToBeRemovedSpy.count(), 1);
    QVERIFY(proxy1RowsAboutToBeInsertedSpy.isEmpty());
    QVERIFY(proxy1RowsInsertedSpy.isEmpty());
    QVERIFY(proxy2RowsAboutToBeInsertedSpy.isEmpty());
    QVERIFY(proxy2RowsInsertedSpy.isEmpty());
    QVERIFY(proxy2RowsAboutToBeRemovedSpy.isEmpty());
    QVERIFY(proxy2RowsRemovedSpy.isEmpty());
    QVERIFY(proxy1rowsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy1rowsMovedSpy.isEmpty());
    QVERIFY(proxy2rowsAboutToBeMovedSpy.isEmpty());
    QVERIFY(proxy2rowsMovedSpy.isEmpty());
    proxy1RowsAboutToBeRemovedSpy.clear();
    proxy1RowsAboutToBeRemovedSpy.clear();
#else
    QSKIP("This test requires the Qt GUI or GenericModel modules");
#endif
}